

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O3

void LD4_SSE2(uint8_t *dst)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 uVar4;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar16;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined4 uVar5;
  undefined5 uVar6;
  undefined6 uVar7;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  
  uVar2 = *(ulong *)(dst + -0x20);
  uVar1 = *(ulong *)(dst + -0x20);
  auVar9._8_4_ = (int)uVar2;
  auVar9._0_8_ = uVar2;
  auVar9._12_4_ = (int)(uVar2 >> 0x20);
  auVar8[0] = pavgb((char)uVar1,(char)(uVar2 >> 0x10));
  uVar10 = (undefined1)(uVar1 >> 8);
  auVar8[1] = pavgb(uVar10,(char)(uVar2 >> 0x18));
  uVar11 = (undefined1)(uVar1 >> 0x10);
  auVar8[2] = pavgb(uVar11,(char)(uVar2 >> 0x20));
  uVar12 = (undefined1)(uVar1 >> 0x18);
  auVar8[3] = pavgb(uVar12,(char)(uVar2 >> 0x28));
  uVar13 = (undefined1)(uVar1 >> 0x20);
  auVar8[4] = pavgb(uVar13,(char)(uVar2 >> 0x30));
  uVar4 = (undefined1)(uVar2 >> 0x38);
  uVar14 = (undefined1)(uVar1 >> 0x28);
  auVar8[5] = pavgb(uVar14,uVar4);
  uVar15 = (undefined1)(uVar1 >> 0x30);
  uVar16 = (undefined1)(uVar1 >> 0x38);
  auVar8[6] = pavgb(uVar15,uVar4);
  auVar8[7] = pavgb(uVar16,0);
  auVar8[8] = pavgb(0,0);
  auVar8[9] = pavgb(0,0);
  auVar8[10] = pavgb(0,0);
  auVar8[0xb] = pavgb(0,0);
  auVar8[0xc] = pavgb(0,0);
  auVar8[0xd] = pavgb(0,0);
  auVar8[0xe] = pavgb(0,0);
  auVar8[0xf] = pavgb(0,0);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (auVar9._8_8_ >> 0x10 | (uVar2 >> 0x38) << 0x30) ^ uVar1;
  auVar9 = psubusb(auVar8,auVar3 & _DAT_0018abf0);
  uVar4 = pavgb(auVar9[0],uVar10);
  uVar10 = pavgb(auVar9[1],uVar11);
  uVar11 = pavgb(auVar9[2],uVar12);
  uVar12 = pavgb(auVar9[3],uVar13);
  uVar5 = CONCAT13(uVar12,CONCAT12(uVar11,CONCAT11(uVar10,uVar4)));
  uVar4 = pavgb(auVar9[4],uVar14);
  uVar6 = CONCAT14(uVar4,uVar5);
  uVar4 = pavgb(auVar9[5],uVar15);
  uVar7 = CONCAT15(uVar4,uVar6);
  uVar16 = pavgb(auVar9[6],uVar16);
  pavgb(auVar9[7],0);
  pavgb(auVar9[8],0);
  pavgb(auVar9[9],0);
  pavgb(auVar9[10],0);
  pavgb(auVar9[0xb],0);
  pavgb(auVar9[0xc],0);
  pavgb(auVar9[0xd],0);
  pavgb(auVar9[0xe],0);
  pavgb(auVar9[0xf],0);
  *(undefined4 *)dst = uVar5;
  *(int *)(dst + 0x20) = (int)((uint5)uVar6 >> 8);
  *(int *)(dst + 0x40) = (int)((uint6)uVar7 >> 0x10);
  *(int *)(dst + 0x60) = (int)(CONCAT16(uVar16,uVar7) >> 0x18);
  return;
}

Assistant:

static void LD4_SSE2(uint8_t* dst) {   // Down-Left
  const __m128i one = _mm_set1_epi8(1);
  const __m128i ABCDEFGH = _mm_loadl_epi64((__m128i*)(dst - BPS));
  const __m128i BCDEFGH0 = _mm_srli_si128(ABCDEFGH, 1);
  const __m128i CDEFGH00 = _mm_srli_si128(ABCDEFGH, 2);
  const __m128i CDEFGHH0 = _mm_insert_epi16(CDEFGH00, dst[-BPS + 7], 3);
  const __m128i avg1 = _mm_avg_epu8(ABCDEFGH, CDEFGHH0);
  const __m128i lsb = _mm_and_si128(_mm_xor_si128(ABCDEFGH, CDEFGHH0), one);
  const __m128i avg2 = _mm_subs_epu8(avg1, lsb);
  const __m128i abcdefg = _mm_avg_epu8(avg2, BCDEFGH0);
  WebPInt32ToMem(dst + 0 * BPS, _mm_cvtsi128_si32(               abcdefg    ));
  WebPInt32ToMem(dst + 1 * BPS, _mm_cvtsi128_si32(_mm_srli_si128(abcdefg, 1)));
  WebPInt32ToMem(dst + 2 * BPS, _mm_cvtsi128_si32(_mm_srli_si128(abcdefg, 2)));
  WebPInt32ToMem(dst + 3 * BPS, _mm_cvtsi128_si32(_mm_srli_si128(abcdefg, 3)));
}